

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

ns_connection * ns_bind(ns_mgr *srv,char *str,ns_callback_t callback,void *user_data)

{
  uint uVar1;
  int __fd;
  int iVar2;
  ns_connection *pnVar3;
  int proto;
  undefined4 local_124;
  socklen_t sa_len;
  socket_address sa;
  int use_ssl;
  char cert [100];
  char ca_cert [100];
  
  ns_parse_address(str,&sa,&proto,&use_ssl,cert,ca_cert);
  if ((use_ssl == 0) || (cert[0] != '\0')) {
    sa_len = 0x10;
    local_124 = 1;
    __fd = socket((uint)sa.sa.sa_family,proto,0);
    if (__fd != -1) {
      iVar2 = setsockopt(__fd,1,2,&local_124,4);
      if (((iVar2 == 0) && (iVar2 = bind(__fd,(sockaddr *)&sa.sa,0x10), iVar2 == 0)) &&
         ((proto == 2 || (iVar2 = listen(__fd,0x1000), iVar2 == 0)))) {
        ns_set_non_blocking_mode(__fd);
        getsockname(__fd,(sockaddr *)&sa.sa,&sa_len);
        pnVar3 = ns_add_sock(srv,__fd,callback,(void *)0x0);
        if (pnVar3 != (ns_connection *)0x0) {
          uVar1 = pnVar3->flags;
          *(ulong *)&pnVar3->sa = CONCAT62(sa._2_6_,sa.sa.sa_family);
          *(uchar (*) [8])((long)&pnVar3->sa + 8) = sa.sin.sin_zero;
          pnVar3->flags = uVar1 | 0x80;
          pnVar3->user_data = user_data;
          pnVar3->callback = callback;
          if (proto != 2) {
            return pnVar3;
          }
          pnVar3->flags = uVar1 | 0x180;
          return pnVar3;
        }
      }
      close(__fd);
    }
  }
  return (ns_connection *)0x0;
}

Assistant:

struct ns_connection *ns_bind(struct ns_mgr *srv, const char *str,
                              ns_callback_t callback, void *user_data) {
  union socket_address sa;
  struct ns_connection *nc = NULL;
  int use_ssl, proto;
  char cert[100], ca_cert[100];
  sock_t sock;

  ns_parse_address(str, &sa, &proto, &use_ssl, cert, ca_cert);
  if (use_ssl && cert[0] == '\0') return NULL;

  if ((sock = ns_open_listening_socket(&sa, proto)) == INVALID_SOCKET) {
  } else if ((nc = ns_add_sock(srv, sock, callback, NULL)) == NULL) {
    closesocket(sock);
  } else {
    nc->sa = sa;
    nc->flags |= NSF_LISTENING;
    nc->user_data = user_data;
    nc->callback = callback;

    if (proto == SOCK_DGRAM) {
      nc->flags |= NSF_UDP;
    }

#ifdef NS_ENABLE_SSL
    if (use_ssl) {
      nc->ssl_ctx = SSL_CTX_new(SSLv23_server_method());
      if (ns_use_cert(nc->ssl_ctx, cert) != 0 ||
          ns_use_ca_cert(nc->ssl_ctx, ca_cert) != 0) {
        ns_close_conn(nc);
        nc = NULL;
      }
    }
#endif

    DBG(("%p sock %d/%d ssl %p %p", nc, sock, proto, nc->ssl_ctx, nc->ssl));
  }

  return nc;
}